

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

char * upb_MdDecoder_DecodeBase92Varint
                 (upb_MdDecoder *d,char *ptr,char first_ch,uint8_t min,uint8_t max,uint32_t *out_val
                 )

{
  char *pcVar1;
  uint32_t *out_val_local;
  uint8_t max_local;
  uint8_t min_local;
  char first_ch_local;
  char *ptr_local;
  upb_MdDecoder *d_local;
  
  pcVar1 = _upb_Base92_DecodeVarint(ptr,d->end,first_ch,min,max,out_val);
  if (pcVar1 == (char *)0x0) {
    upb_MdDecoder_ErrorJmp(d,"Overlong varint");
  }
  return pcVar1;
}

Assistant:

UPB_INLINE const char* upb_MdDecoder_DecodeBase92Varint(
    upb_MdDecoder* d, const char* ptr, char first_ch, uint8_t min, uint8_t max,
    uint32_t* out_val) {
  ptr = _upb_Base92_DecodeVarint(ptr, d->end, first_ch, min, max, out_val);
  if (!ptr) upb_MdDecoder_ErrorJmp(d, "Overlong varint");
  return ptr;
}